

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O0

PTR __thiscall brynet::net::TcpService::getRandomEventLoop(TcpService *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  __shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  PTR *pPVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  PTR PVar5;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  int randNum;
  TcpService *this_local;
  PTR *ret;
  
  lock._M_device._7_1_ = 0;
  std::shared_ptr<brynet::net::EventLoop>::shared_ptr((shared_ptr<brynet::net::EventLoop> *)this);
  lock._M_device._0_4_ = rand();
  std::lock_guard<std::mutex>::lock_guard(&local_28,(mutex_type *)(in_RSI + 0x30));
  bVar1 = std::
          vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
          ::empty((vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                   *)(in_RSI + 0x18));
  if (!bVar1) {
    uVar2 = (ulong)(int)lock._M_device;
    sVar3 = std::
            vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
            ::size((vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                    *)(in_RSI + 0x18));
    this_00 = (__shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                 ::operator[]((vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                               *)(in_RSI + 0x18),uVar2 % sVar3);
    this_01 = std::
              __shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_00);
    pPVar4 = IOLoopData::getEventLoop(this_01);
    std::shared_ptr<brynet::net::EventLoop>::operator=
              ((shared_ptr<brynet::net::EventLoop> *)this,pPVar4);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  PVar5.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar5.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PTR)PVar5.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

EventLoop::PTR TcpService::getRandomEventLoop()
{
    EventLoop::PTR ret;
    {
        auto randNum = rand();
        std::lock_guard<std::mutex> lock(mIOLoopGuard);
        if (!mIOLoopDatas.empty())
        {
            ret = mIOLoopDatas[randNum % mIOLoopDatas.size()]->getEventLoop();
        }
    }

    return ret;
}